

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_GetGammas(ARKodeMem ark_mem,sunrealtype *gamma,sunrealtype *gamrat,int **jcur,
                     int *dgamma_fail)

{
  double dVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    iVar3 = -0x15;
    arkProcessError(ark_mem,-0x15,0xc0f,"mriStep_GetGammas",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    *gamma = *(sunrealtype *)((long)pvVar2 + 0xc0);
    dVar1 = *(double *)((long)pvVar2 + 0xd0);
    *gamrat = dVar1;
    *jcur = (int *)((long)pvVar2 + 0x130);
    *dgamma_fail = (uint)(*(double *)((long)pvVar2 + 0xd8) <= ABS(dVar1 + -1.0));
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mriStep_GetGammas(ARKodeMem ark_mem, sunrealtype* gamma, sunrealtype* gamrat,
                      sunbooleantype** jcur, sunbooleantype* dgamma_fail)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set outputs */
  *gamma       = step_mem->gamma;
  *gamrat      = step_mem->gamrat;
  *jcur        = &step_mem->jcur;
  *dgamma_fail = (SUNRabs(*gamrat - ONE) >= step_mem->dgmax);

  return (ARK_SUCCESS);
}